

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

Image * __thiscall pbrt::RGBFilm::GetImage(RGBFilm *this,ImageMetadata *metadata,Float splatScale)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  long in_RSI;
  Image *in_RDI;
  atomic<int> nClamped;
  PixelFormat format;
  Image *image;
  memory_order __b_1;
  memory_order __b;
  Bounds2<int> *in_stack_fffffffffffffdd8;
  Tuple2<pbrt::Vector2,_int> in_stack_fffffffffffffde0;
  anon_class_32_4_d6398e5a *in_stack_fffffffffffffde8;
  function<void_(pbrt::Point2<int>)> *in_stack_fffffffffffffdf0;
  int *piVar1;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  function<void_(pbrt::Point2<int>)> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  string *local_1c0;
  int local_11c;
  Bounds2<int> *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffef9;
  undefined6 in_stack_fffffffffffffefa;
  undefined4 in_stack_ffffffffffffff00;
  LogLevel in_stack_ffffffffffffff04;
  PixelFormat in_stack_ffffffffffffff0c;
  Image *this_00;
  Allocator in_stack_ffffffffffffff18;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff20;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffff30;
  undefined1 local_a8 [32];
  undefined1 *local_88;
  size_t local_80;
  Tuple2<pbrt::Vector2,_int> local_64;
  undefined1 local_51;
  int local_50;
  int local_2c;
  memory_order local_28;
  int local_24;
  int *local_20;
  int local_14;
  memory_order local_10;
  int local_c;
  int *local_8;
  
  if (logging::logLevel < 1) {
    Log(in_stack_ffffffffffffff04,
        (char *)CONCAT62(in_stack_fffffffffffffefa,
                         CONCAT11(in_stack_fffffffffffffef9,in_stack_fffffffffffffef8)),
        in_stack_fffffffffffffef4,(char *)in_stack_fffffffffffffee8);
  }
  local_50 = 2 - (*(byte *)(in_RSI + 0x5c) & 1);
  local_51 = 0;
  local_64 = (Tuple2<pbrt::Vector2,_int>)Bounds2<int>::Diagonal(in_stack_fffffffffffffdd8);
  Point2<int>::Point2<int>(&in_stack_fffffffffffffdd8->pMin,(Vector2<int>)in_stack_fffffffffffffde0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (char *)in_stack_fffffffffffffe18,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (char *)in_stack_fffffffffffffe18,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  this_00 = (Image *)local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (char *)in_stack_fffffffffffffe18,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_88 = &stack0xffffffffffffff18;
  local_80 = 3;
  v._M_len = (size_type)in_stack_fffffffffffffdf0;
  v._M_array = (iterator)in_stack_fffffffffffffde8;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffffde0,v);
  ColorEncoding::TaggedPointer((ColorEncoding *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8)
  ;
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffde0);
  Image::Image(this_00,in_stack_ffffffffffffff0c,(Point2i)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff20,
               (ColorEncoding *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_ffffffffffffff18);
  local_1c0 = (string *)&local_88;
  do {
    local_1c0 = local_1c0 + -0x20;
    std::__cxx11::string::~string(local_1c0);
  } while (local_1c0 != (string *)&stack0xffffffffffffff18);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffefa);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffefb);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
  local_11c = 0;
  std::function<void(pbrt::Point2<int>)>::
  function<pbrt::RGBFilm::GetImage(pbrt::ImageMetadata*,float)::__0,void>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ParallelFor2D((Bounds2i *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                in_stack_fffffffffffffe18);
  std::function<void_(pbrt::Point2<int>)>::~function((function<void_(pbrt::Point2<int>)> *)0x8bf1f2)
  ;
  piVar1 = &local_11c;
  local_c = 5;
  local_8 = piVar1;
  local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_c - 1U < 2) {
    local_14 = *piVar1;
  }
  else if (local_c == 5) {
    local_14 = *piVar1;
  }
  else {
    local_14 = *piVar1;
  }
  if (0 < local_14) {
    piVar1 = &local_11c;
    local_24 = 5;
    local_20 = piVar1;
    local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_24 - 1U < 2) {
      local_2c = *piVar1;
    }
    else if (local_24 == 5) {
      local_2c = *piVar1;
    }
    else {
      local_2c = *piVar1;
    }
    Warning<int>((char *)CONCAT44(local_24,in_stack_fffffffffffffe10),piVar1);
  }
  pstd::optional<pbrt::Bounds2<int>_>::operator=
            ((optional<pbrt::Bounds2<int>_> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffee8);
  pstd::optional<pbrt::Point2<int>_>::operator=
            ((optional<pbrt::Point2<int>_> *)in_stack_fffffffffffffde0,
             &in_stack_fffffffffffffee8->pMin);
  pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
            ((optional<const_pbrt::RGBColorSpace_*> *)in_stack_fffffffffffffde0,
             (RGBColorSpace **)in_stack_fffffffffffffee8);
  return in_RDI;
}

Assistant:

Image RGBFilm::GetImage(ImageMetadata *metadata, Float splatScale) {
    // Convert image to RGB and compute final pixel values
    LOG_VERBOSE("Converting image to RGB and computing final weighted pixel values");
    PixelFormat format = writeFP16 ? PixelFormat::Half : PixelFormat::Float;
    Image image(format, Point2i(pixelBounds.Diagonal()), {"R", "G", "B"});

    std::atomic<int> nClamped{0};
    ParallelFor2D(pixelBounds, [&](Point2i p) {
        RGB rgb = GetPixelRGB(p, splatScale);

        if (writeFP16 && std::max({rgb.r, rgb.g, rgb.b}) > 65504) {
            if (rgb.r > 65504)
                rgb.r = 65504;
            if (rgb.g > 65504)
                rgb.g = 65504;
            if (rgb.b > 65504)
                rgb.b = 65504;
            ++nClamped;
        }

        Point2i pOffset(p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y);
        image.SetChannels(pOffset, {rgb[0], rgb[1], rgb[2]});
    });

    if (nClamped.load() > 0)
        Warning("%d pixel values clamped to maximum fp16 value.", nClamped.load());

    metadata->pixelBounds = pixelBounds;
    metadata->fullResolution = fullResolution;
    metadata->colorSpace = colorSpace;

    return image;
}